

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::KMaxPooling::backward_impl
          (KMaxPooling *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Dim *this_00;
  float fVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  CoeffReturnType pfVar7;
  Scalar *pSVar8;
  ostream *poVar9;
  ulong row;
  ulong col;
  long col_00;
  uint k;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  uVar5 = (this->super_Node).dim.d[0];
  this_00 = &(this->super_Node).dim;
  uVar6 = 1;
  if (1 < (this->super_Node).dim.nd) {
    uVar6 = (ulong)(this->super_Node).dim.d[1];
  }
  pvVar3 = (this->super_Node).aux_mem;
  row = 0;
  do {
    if (row == uVar5) {
      return;
    }
    for (col = 0; uVar6 != col; col = col + 1) {
      uVar4 = Dim::size(this_00);
      if (uVar4 <= col) {
        __assert_fail("mi < dim.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/conv.cc"
                      ,0x14d,
                      "virtual void cnn::KMaxPooling::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                     );
      }
      iVar2 = *(int *)((long)pvVar3 + col * 4);
      col_00 = (long)iVar2;
      Tensor::operator*(&local_70,dEdxi);
      if ((col_00 < 0) ||
         (local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value < col_00)) {
        poVar9 = operator<<((ostream *)&std::cerr,this_00);
        Tensor::operator*(&local_70,fx);
        poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                           *)&local_70);
        poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
        Tensor::operator*(&local_50,dEdxi);
        poVar9 = Eigen::operator<<(poVar9,(DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                                           *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar9);
        std::operator<<((ostream *)&std::cerr,"MM:");
        uVar6 = 0;
        while( true ) {
          uVar5 = Dim::size(this_00);
          if (uVar5 <= uVar6) break;
          poVar9 = std::operator<<((ostream *)&std::cerr,' ');
          std::ostream::operator<<(poVar9,*(int *)((long)pvVar3 + uVar6 * 4));
          uVar6 = uVar6 + 1;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        poVar9 = std::operator<<((ostream *)&std::cerr,"BAD: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar2);
        std::endl<char,std::char_traits<char>>(poVar9);
        abort();
      }
      Tensor::operator*(&local_70,dEdf);
      pfVar7 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             *)&local_70,row,col);
      fVar1 = *pfVar7;
      Tensor::operator*(&local_50,dEdxi);
      pSVar8 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_50,row,col_00);
      *pSVar8 = fVar1 + *pSVar8;
    }
    row = row + 1;
  } while( true );
}

Assistant:

void KMaxPooling::backward_impl(const vector<const Tensor*>& xs,
                           const Tensor& fx,
                           const Tensor& dEdf,
                           unsigned i,
                           Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("KMaxPooling::backward not implemented for CUDA");
#else
  const unsigned rows = dim.rows();
  const unsigned cols = dim.cols();
  const int* maxmap = static_cast<const int*>(aux_mem);
  for (unsigned i = 0; i < rows; ++i) {
    unsigned mi = 0;
    for (unsigned j = 0; j < cols; ++j) {
      assert(mi < dim.size());
      const int oj = maxmap[mi++];
      if (oj > (*dEdxi).cols() || oj < 0) {
        cerr << dim << (*fx) << endl << (*dEdxi) << endl;
        cerr << "MM:"; for (unsigned k=0;k < dim.size(); ++k) cerr << ' ' << maxmap[k];
        cerr << endl;
        cerr << "BAD: " << oj << endl; abort();
      }
      (*dEdxi)(i, oj) += (*dEdf)(i, j);
    }
  }
#endif
}